

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O3

bool S2ShapeIndex::IteratorBase::LocateImpl<MutableS2ShapeIndex::Iterator>
               (S2Point *target_point,Iterator *it)

{
  __pointer_type pSVar1;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar2;
  node_type *pnVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  const_iterator cVar7;
  S2CellId target;
  S2CellId local_20;
  S2CellId local_18;
  
  S2CellId::S2CellId(&local_20,target_point);
  local_18.id_ = local_20.id_;
  cVar7 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::lower_bound<S2CellId>
                    ((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                      *)&it->index_->cell_map_,&local_18);
  pbVar2 = cVar7.node;
  (it->iter_).node = pbVar2;
  iVar5 = cVar7.position;
  (it->iter_).position = iVar5;
  if ((pbVar2 == (it->end_).node) && (iVar5 == (it->end_).position)) {
    (it->super_IteratorBase).id_.id_ = 0xffffffffffffffff;
    (it->super_IteratorBase).cell_._M_b._M_p = (__pointer_type)0x0;
  }
  else {
    if (((undefined1  [16])cVar7 & (undefined1  [16])0x7) != (undefined1  [16])0x0)
    goto LAB_00194744;
    uVar4 = *(ulong *)(pbVar2 + (long)iVar5 * 0x10 + 0x10);
    pSVar1 = *(__pointer_type *)(pbVar2 + (long)iVar5 * 0x10 + 0x18);
    (it->super_IteratorBase).id_.id_ = uVar4;
    (it->super_IteratorBase).cell_._M_b._M_p = pSVar1;
    if ((uVar4 != 0xffffffffffffffff) && (uVar4 - (~uVar4 & uVar4 - 1) <= local_20.id_)) {
      return true;
    }
  }
  pnVar3 = gtl::internal_btree::
           btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
           ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                       *)&it->index_->cell_map_);
  if (((it->iter_).node != pnVar3) || ((it->iter_).position != 0)) {
    gtl::internal_btree::
    btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
    ::decrement(&it->iter_);
    pbVar2 = (it->iter_).node;
    iVar5 = (it->iter_).position;
    if ((pbVar2 == (it->end_).node) && (iVar5 == (it->end_).position)) {
      (it->super_IteratorBase).id_.id_ = 0xffffffffffffffff;
      (it->super_IteratorBase).cell_._M_b._M_p = (__pointer_type)0x0;
      uVar4 = 0xffffffffffffffff;
    }
    else {
      if (((ulong)pbVar2 & 7) != 0) {
LAB_00194744:
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                      ,0x1e1,
                      "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                     );
      }
      lVar6 = (long)iVar5 * 0x10;
      uVar4 = *(ulong *)(pbVar2 + lVar6 + 0x10);
      pSVar1 = *(__pointer_type *)&pbVar2[lVar6 + 0x18].field_0x0;
      (it->super_IteratorBase).id_.id_ = uVar4;
      (it->super_IteratorBase).cell_._M_b._M_p = pSVar1;
    }
    if (local_20.id_ <= (uVar4 - 1 | uVar4)) {
      return true;
    }
  }
  return false;
}

Assistant:

inline bool S2ShapeIndex::IteratorBase::LocateImpl(
    const S2Point& target_point, Iter* it) {
  // Let I = cell_map_->lower_bound(T), where T is the leaf cell containing
  // "target_point".  Then if T is contained by an index cell, then the
  // containing cell is either I or I'.  We test for containment by comparing
  // the ranges of leaf cells spanned by T, I, and I'.

  S2CellId target(target_point);
  it->Seek(target);
  if (!it->done() && it->id().range_min() <= target) return true;
  if (it->Prev() && it->id().range_max() >= target) return true;
  return false;
}